

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cc
# Opt level: O0

int __thiscall raptor::Connection::ParsingProtocol(Connection *this)

{
  IProtocol *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  uint8_t *puVar3;
  size_t sVar4;
  size_t n;
  int local_78;
  byte local_61;
  undefined1 local_60 [7];
  bool reach_tail;
  Slice package;
  int pack_len;
  size_t read_size;
  int package_counter;
  size_t header_size;
  size_t cache_size;
  Connection *this_local;
  
  header_size = SliceBuffer::GetBufferLength(&this->_rcv_buffer);
  iVar2 = (*this->_proto->_vptr_IProtocol[2])();
  read_size._4_4_ = 0;
  do {
    if (header_size == 0) goto LAB_0010d02e;
    package._data._20_4_ = 0;
    Slice::Slice((Slice *)local_60);
    local_61 = ReadSliceFromRecvBuffer(this,CONCAT44(extraout_var,iVar2),(Slice *)local_60);
    pIVar1 = this->_proto;
    puVar3 = Slice::begin((Slice *)local_60);
    sVar4 = Slice::size((Slice *)local_60);
    package._data._20_4_ = (*pIVar1->_vptr_IProtocol[3])(pIVar1,puVar3,sVar4);
    if ((int)package._data._20_4_ < 0) {
      LogFormatPrint("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/core/linux/connection.cc"
                     ,0xed,kLogLevelError,"tcp client: internal protocol error(pack_len = %d)",
                     (ulong)(uint)package._data._20_4_);
      this_local._4_4_ = -1;
      local_78 = 1;
    }
    else if (package._data._20_4_ == 0) {
      if ((local_61 & 1) == 0) {
LAB_0010ced7:
        sVar4 = Slice::size((Slice *)local_60);
        if (sVar4 < (ulong)(long)(int)package._data._20_4_) {
          SliceBuffer::GetHeader((Slice *)&n,&this->_rcv_buffer,(long)(int)package._data._20_4_);
          Slice::operator=((Slice *)local_60,(Slice *)&n);
          Slice::~Slice((Slice *)&n);
        }
        else {
          sVar4 = Slice::size((Slice *)local_60);
          Slice::CutTail((Slice *)local_60,sVar4 - (long)(int)package._data._20_4_);
        }
        (*this->_service->_vptr_INotificationTransfer[3])(this->_service,this->_cid,local_60);
        SliceBuffer::MoveHeader(&this->_rcv_buffer,(long)(int)package._data._20_4_);
        header_size = SliceBuffer::GetBufferLength(&this->_rcv_buffer);
        read_size._4_4_ = read_size._4_4_ + 1;
        local_78 = 0;
      }
      else {
        local_78 = 6;
      }
    }
    else {
      if ((ulong)(long)(int)package._data._20_4_ <= header_size) goto LAB_0010ced7;
      local_78 = 6;
    }
    Slice::~Slice((Slice *)local_60);
  } while (local_78 == 0);
  if (local_78 != 1) {
LAB_0010d02e:
    this_local._4_4_ = read_size._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int Connection::ParsingProtocol() {
    size_t cache_size = _rcv_buffer.GetBufferLength();
    size_t header_size = _proto->GetMaxHeaderSize();
    int package_counter = 0;

    while (cache_size > 0) {
        size_t read_size = header_size;
        int pack_len = 0;
        Slice package;
        do {
            bool reach_tail = ReadSliceFromRecvBuffer(read_size, package);
            pack_len = _proto->CheckPackageLength(package.begin(), package.size());
            if (pack_len < 0) {
                log_error("tcp client: internal protocol error(pack_len = %d)", pack_len);
                return -1;
            }

            // equal 0 means we need more data
            if (pack_len == 0) {
                if (reach_tail) {
                    goto done;
                }
                read_size *= 2;
                continue;
            }

            // We got the length of a whole packet
            if (cache_size >= (size_t)pack_len) {
                break;
            }
            goto done;
        } while (false);

        if (package.size() < static_cast<size_t>(pack_len)) {
            package = _rcv_buffer.GetHeader(pack_len);
        } else {
            size_t n = package.size() - pack_len;
            package.CutTail(n);
        }
        _service->OnDataReceived(_cid, &package);
        _rcv_buffer.MoveHeader(pack_len);

        cache_size = _rcv_buffer.GetBufferLength();
        package_counter++;
    }
done:
    return package_counter;
}